

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O0

PhyloTreeEdge *
PhyloTree::getFirstCommonEdge
          (vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *t1_edges,
          vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *t2_edges)

{
  __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
  __last;
  __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
  __last_00;
  bool bVar1;
  int iVar2;
  pointer pPVar3;
  string *msg;
  PhyloTreeEdge *in_RDI;
  double dVar4;
  PhyloTreeEdge *this;
  iterator last2;
  iterator last1;
  iterator first2;
  iterator first1;
  PhyloTreeEdge *in_stack_fffffffffffffe68;
  Bipartition *in_stack_fffffffffffffe70;
  allocator *this_00;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
  in_stack_fffffffffffffe80;
  __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
  *this_01;
  undefined8 in_stack_fffffffffffffe88;
  int iVar5;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  PhyloTreeEdge *in_stack_fffffffffffffea0;
  bool local_119;
  allocator local_101;
  string local_100 [168];
  PhyloTreeEdge *local_58;
  PhyloTreeEdge *local_50;
  __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
  local_48;
  __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
  local_40;
  PhyloTreeEdge *local_38;
  PhyloTreeEdge *local_30;
  PhyloTreeEdge *local_28;
  PhyloTreeEdge *local_20;
  
  local_20 = (PhyloTreeEdge *)
             std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::begin
                       ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                        in_stack_fffffffffffffe68);
  local_28 = (PhyloTreeEdge *)
             std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::end
                       ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                        in_stack_fffffffffffffe68);
  __last._M_current._4_4_ = in_stack_fffffffffffffe7c;
  __last._M_current._0_4_ = in_stack_fffffffffffffe78;
  std::
  sort<__gnu_cxx::__normal_iterator<PhyloTreeEdge*,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>>>
            (in_stack_fffffffffffffe80,__last);
  local_30 = (PhyloTreeEdge *)
             std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::begin
                       ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                        in_stack_fffffffffffffe68);
  local_38 = (PhyloTreeEdge *)
             std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::end
                       ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                        in_stack_fffffffffffffe68);
  __last_00._M_current._4_4_ = in_stack_fffffffffffffe7c;
  __last_00._M_current._0_4_ = in_stack_fffffffffffffe78;
  std::
  sort<__gnu_cxx::__normal_iterator<PhyloTreeEdge*,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>>>
            (in_stack_fffffffffffffe80,__last_00);
  local_40._M_current =
       (PhyloTreeEdge *)
       std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::begin(in_stack_fffffffffffffe68);
  local_48._M_current =
       (PhyloTreeEdge *)
       std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::begin(in_stack_fffffffffffffe68);
  local_50 = (PhyloTreeEdge *)
             std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::end
                       ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                        in_stack_fffffffffffffe68);
  local_58 = (PhyloTreeEdge *)
             std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::end
                       ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                        in_stack_fffffffffffffe68);
  while( true ) {
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                          *)in_stack_fffffffffffffe70,
                         (__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                          *)in_stack_fffffffffffffe68);
      local_119 = false;
      if (bVar1) {
        local_119 = __gnu_cxx::operator!=
                              ((__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                                *)in_stack_fffffffffffffe70,
                               (__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                                *)in_stack_fffffffffffffe68);
      }
      if (local_119 == false) {
        msg = (string *)__cxa_allocate_exception(0x10);
        this_00 = &local_101;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_100,"No common edges",this_00);
        edge_not_found_exception::edge_not_found_exception((edge_not_found_exception *)this_00,msg);
        __cxa_throw(msg,&edge_not_found_exception::typeinfo,
                    edge_not_found_exception::~edge_not_found_exception);
      }
      __gnu_cxx::
      __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
      ::operator*(&local_40);
      __gnu_cxx::
      __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
      ::operator*(&local_48);
      bVar1 = Bipartition::operator<
                        (in_stack_fffffffffffffe70,&in_stack_fffffffffffffe68->super_Bipartition);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
      ::operator->(&local_40);
      bVar1 = PhyloTreeEdge::isCompatibleWith
                        ((PhyloTreeEdge *)
                         CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                         in_stack_fffffffffffffe90);
      iVar5 = (int)((ulong)in_stack_fffffffffffffe88 >> 0x20);
      if (bVar1) {
        __gnu_cxx::
        __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
        ::operator->(&local_40);
        PhyloTreeEdge::asSplit(in_stack_fffffffffffffe68);
        pPVar3 = __gnu_cxx::
                 __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                 ::operator->(&local_40);
        PhyloTreeEdge::getAttribute(pPVar3);
        pPVar3 = __gnu_cxx::
                 __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                 ::operator->(&local_40);
        PhyloTreeEdge::getOriginalID(pPVar3);
        PhyloTreeEdge::PhyloTreeEdge
                  (in_stack_fffffffffffffea0,
                   (Bipartition *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                   (double)in_stack_fffffffffffffe90,iVar5);
        Bipartition::~Bipartition((Bipartition *)0x17015e);
        return in_RDI;
      }
      __gnu_cxx::
      __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
      ::operator++(&local_40);
    }
    __gnu_cxx::
    __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
    ::operator*(&local_48);
    __gnu_cxx::
    __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
    ::operator*(&local_40);
    bVar1 = Bipartition::operator<
                      (in_stack_fffffffffffffe70,&in_stack_fffffffffffffe68->super_Bipartition);
    iVar5 = (int)((ulong)in_stack_fffffffffffffe88 >> 0x20);
    if (!bVar1) {
      __gnu_cxx::
      __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
      ::operator->(&local_40);
      PhyloTreeEdge::asSplit(in_stack_fffffffffffffe68);
      pPVar3 = __gnu_cxx::
               __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
               ::operator->(&local_40);
      dVar4 = PhyloTreeEdge::getLength(pPVar3);
      pPVar3 = __gnu_cxx::
               __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
               ::operator->(&local_48);
      this = (PhyloTreeEdge *)PhyloTreeEdge::getLength(pPVar3);
      dVar4 = dVar4 - (double)this;
      pPVar3 = __gnu_cxx::
               __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
               ::operator->(&local_40);
      iVar2 = PhyloTreeEdge::getOriginalID(pPVar3);
      PhyloTreeEdge::PhyloTreeEdge
                (this,(Bipartition *)CONCAT44(iVar2,in_stack_fffffffffffffe98),dVar4,iVar5);
      Bipartition::~Bipartition((Bipartition *)0x170287);
      return in_RDI;
    }
    __gnu_cxx::
    __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
    ::operator->(&local_48);
    bVar1 = PhyloTreeEdge::isCompatibleWith
                      ((PhyloTreeEdge *)
                       CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                       in_stack_fffffffffffffe90);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
    ::operator++(&local_48);
  }
  this_01 = &local_48;
  __gnu_cxx::
  __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>::
  operator->(this_01);
  PhyloTreeEdge::asSplit(in_stack_fffffffffffffe68);
  pPVar3 = __gnu_cxx::
           __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
           ::operator->(this_01);
  dVar4 = PhyloTreeEdge::getAttribute(pPVar3);
  iVar5 = (int)((ulong)dVar4 >> 0x20);
  pPVar3 = __gnu_cxx::
           __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
           ::operator->(&local_48);
  PhyloTreeEdge::getOriginalID(pPVar3);
  PhyloTreeEdge::PhyloTreeEdge
            (in_stack_fffffffffffffea0,
             (Bipartition *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
             (double)in_stack_fffffffffffffe90,iVar5);
  Bipartition::~Bipartition((Bipartition *)0x17035d);
  return in_RDI;
}

Assistant:

PhyloTreeEdge PhyloTree::getFirstCommonEdge(vector<PhyloTreeEdge> &t1_edges, vector<PhyloTreeEdge> &t2_edges) {
    std::sort(t1_edges.begin(), t1_edges.end());
    std::sort(t2_edges.begin(), t2_edges.end());

    auto first1 = t1_edges.begin();
    auto first2 = t2_edges.begin();
    auto last1 = t1_edges.end();
    auto last2 = t2_edges.end();

    while (first1 != last1 && first2 != last2) {
        if (*first1 < *first2) {
            if (first1->isCompatibleWith(t2_edges)) {
                return PhyloTreeEdge(first1->asSplit(), first1->getAttribute(), first1->getOriginalID());
            }
            ++first1; // first1 not in list2
        } else {
            if (!(*first2 < *first1)) { // first1 == first2
                return PhyloTreeEdge(first1->asSplit(), first1->getLength() - first2->getLength(), first1->getOriginalID());
            }
            else { // first2 not in list1
                if (first2->isCompatibleWith(t1_edges)) {
                    return PhyloTreeEdge(first2->asSplit(), first2->getAttribute(), first2->getOriginalID());
                }
            }
            ++first2;
        }
    }
    throw edge_not_found_exception("No common edges");
}